

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  byte *limit;
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  byte *pbVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  uint *puVar10;
  long in_FS_OFFSET;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  uint local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = this->data_;
  pcVar6 = (this->value_).data_ + ((this->value_).size_ - (long)pcVar2);
  uVar5 = (uint)pcVar6;
  this->current_ = uVar5;
  uVar8 = this->restarts_;
  if (uVar5 < uVar8) {
    uVar7 = (ulong)pcVar6 & 0xffffffff;
    if ((long)(uVar8 - uVar7) < 3) {
LAB_00d521bf:
      pbVar4 = (byte *)0x0;
    }
    else {
      limit = (byte *)(pcVar2 + uVar8);
      pbVar9 = (byte *)(pcVar2 + uVar7);
      local_24 = (uint)*pbVar9;
      local_28 = (uint)pbVar9[1];
      local_2c = (uint)pbVar9[2];
      if ((byte)(pbVar9[1] | *pbVar9 | pbVar9[2]) < 0x80) {
        pbVar9 = pbVar9 + 3;
      }
      else {
        if (uVar5 < uVar8) {
          uVar8 = (uint)(char)*pbVar9;
          pbVar4 = (byte *)(ulong)uVar8;
          if ((int)uVar8 < 0) goto LAB_00d522c3;
          pbVar9 = pbVar9 + 1;
          local_24 = uVar8;
        }
        else {
LAB_00d522c3:
          pbVar4 = (byte *)GetVarint32PtrFallback((char *)pbVar9,(char *)limit,&local_24);
          pbVar9 = pbVar4;
        }
        if (pbVar9 == (byte *)0x0) goto LAB_00d521bf;
        if (pbVar9 < limit) {
          bVar1 = *pbVar9;
          if (-1 < (char)bVar1) {
            pbVar4 = pbVar9 + 1;
            local_28 = (int)(char)bVar1;
          }
          if ((char)bVar1 < '\0') goto LAB_00d522f6;
        }
        else {
LAB_00d522f6:
          pbVar4 = (byte *)GetVarint32PtrFallback((char *)pbVar9,(char *)limit,&local_28);
        }
        if (pbVar4 == (byte *)0x0) goto LAB_00d521bf;
        if (pbVar4 < limit) {
          bVar1 = *pbVar4;
          if (-1 < (char)bVar1) {
            pbVar9 = pbVar4 + 1;
            local_2c = (int)(char)bVar1;
          }
          if ((char)bVar1 < '\0') goto LAB_00d52326;
        }
        else {
LAB_00d52326:
          pbVar9 = (byte *)GetVarint32PtrFallback((char *)pbVar4,(char *)limit,&local_2c);
        }
        if (pbVar9 == (byte *)0x0) goto LAB_00d521bf;
      }
      pbVar4 = (byte *)0x0;
      if (local_2c + local_28 <= (uint)((int)limit - (int)pbVar9)) {
        pbVar4 = pbVar9;
      }
    }
    if ((pbVar4 != (byte *)0x0) && ((ulong)local_24 <= (this->key_)._M_string_length)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&this->key_,(ulong)local_24,'\0');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->key_,(char *)pbVar4,(ulong)local_28);
      (this->value_).data_ = (char *)(pbVar4 + local_28);
      (this->value_).size_ = (ulong)local_2c;
      uVar8 = this->restart_index_ + 1;
      bVar3 = true;
      if (uVar8 < this->num_restarts_) {
        puVar10 = (uint *)(this->data_ + (ulong)this->restarts_ + (ulong)uVar8 * 4);
        do {
          if (this->current_ <= *puVar10) break;
          this->restart_index_ = uVar8;
          uVar8 = uVar8 + 1;
          puVar10 = puVar10 + 1;
        } while (this->num_restarts_ != uVar8);
      }
      goto LAB_00d5222f;
    }
    CorruptionError(this);
  }
  else {
    this->current_ = uVar8;
    this->restart_index_ = this->num_restarts_;
  }
  bVar3 = false;
LAB_00d5222f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }